

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void finish(log_multi *b)

{
  v_array<node> *pvVar1;
  long in_RDI;
  size_t i;
  v_array<node> *pvVar2;
  v_array<node> *this;
  
  pvVar2 = (v_array<node> *)0x0;
  while( true ) {
    this = pvVar2;
    pvVar1 = (v_array<node> *)v_array<node>::size((v_array<node> *)(in_RDI + 8));
    if (pvVar1 <= pvVar2) break;
    v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(size_t)this);
    v_array<node_pred>::delete_v((v_array<node_pred> *)this);
    pvVar2 = (v_array<node> *)((long)&this->_begin + 1);
  }
  v_array<node>::delete_v(this);
  return;
}

Assistant:

void finish(log_multi& b)
{
  // save_node_stats(b);
  for (size_t i = 0; i < b.nodes.size(); i++) b.nodes[i].preds.delete_v();
  b.nodes.delete_v();
}